

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

int __thiscall gulcalc::init(gulcalc *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int gulstream_type;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  
  gulstream_type = 0x1000001;
  if (this->itemWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->itemWriter_)(&gulstream_type,4,1);
    (*this->itemWriter_)(&this->samplesize_,4,1);
  }
  if (this->coverageWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    gulstream_type = 0x1000002;
    (*this->coverageWriter_)(&gulstream_type,4,1);
    (*this->coverageWriter_)(&this->samplesize_,4,1);
  }
  if (this->lossWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    gulstream_type = 0x2000001;
    (*this->lossWriter_)(&gulstream_type,4,1);
    (*this->lossWriter_)(&this->samplesize_,4,1);
  }
  if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    gulstream_type = 0x2000001;
    (*this->correlatedWriter_)(&gulstream_type,4,1);
    (*this->correlatedWriter_)(&this->samplesize_,4,1);
  }
  local_20.__r = 1000;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
  return extraout_EAX;
}

Assistant:

void gulcalc::init()
{
	int	gulstream_type = gul_item_stream | gulstream_id;

	if (itemWriter_ != 0) {
		itemWriter_(&gulstream_type, sizeof(gulstream_type), 1);
		itemWriter_(&samplesize_, sizeof(samplesize_), 1);
	}
	
	if (coverageWriter_ != 0) {
        gulstream_type = gul_coverage_stream | gulstream_id;
		coverageWriter_(&gulstream_type, sizeof(gulstream_type), 1);
		coverageWriter_(&samplesize_, sizeof(samplesize_), 1);
	}

	if (lossWriter_ != 0) {
            gulstream_type = gul_item_stream | loss_stream_id;
            lossWriter_(&gulstream_type, sizeof(gulstream_type), 1);
            lossWriter_(&samplesize_, sizeof(samplesize_), 1);
    }

	if(correlatedWriter_ != 0) {
	    gulstream_type = gul_item_stream | loss_stream_id;
	    correlatedWriter_(&gulstream_type, sizeof(gulstream_type), 1);
	    correlatedWriter_(&samplesize_, sizeof(samplesize_), 1);
	}

	std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY));
}